

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Cache.cpp
# Opt level: O3

uint32_t __thiscall Cache::getAddr(Cache *this,Block *b)

{
  bool bVar1;
  uint uVar2;
  char cVar3;
  char cVar4;
  ulong uVar5;
  byte bVar6;
  byte bVar7;
  
  uVar2 = (this->policy).blockSize;
  cVar3 = -1;
  bVar6 = 0xff;
  if (uVar2 != 0) {
    bVar7 = 0;
    bVar6 = 0;
    if (uVar2 != 1) {
      do {
        bVar6 = bVar7 + 1;
        bVar1 = 3 < uVar2;
        uVar2 = uVar2 >> 1;
        bVar7 = bVar6;
      } while (bVar1);
    }
  }
  uVar5 = (ulong)(this->policy).blockNum / (ulong)(this->policy).associativity;
  if ((int)uVar5 != 0) {
    cVar4 = '\0';
    cVar3 = '\0';
    if ((int)uVar5 != 1) {
      do {
        cVar3 = cVar4 + '\x01';
        uVar2 = (uint)uVar5;
        uVar5 = uVar5 >> 1;
        cVar4 = cVar3;
      } while (3 < uVar2);
    }
  }
  return b->id << (bVar6 & 0x1f) | b->tag << (cVar3 + bVar6 & 0x1f);
}

Assistant:

uint32_t Cache::getAddr(Cache::Block &b) {
  uint32_t offsetBits = log2i(policy.blockSize);
  uint32_t idBits = log2i(policy.blockNum / policy.associativity);
  return (b.tag << (offsetBits + idBits)) | (b.id << offsetBits);
}